

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O2

kd_tree_data_type * __thiscall
pico_tree::internal::
build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>,3ul>
::operator()(kd_tree_data_type *__return_storage_ptr__,void *this,
            space_wrapper<Eigen::Matrix<float,_3,__1,_0,_3,__1>_> space,
            splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *param_4)

{
  node *pnVar1;
  pointer piVar2;
  node_type *pnVar3;
  int iVar4;
  box_type root_box;
  vector<int,_std::allocator<int>_> indices;
  node_allocator_type allocator;
  space_type local_a8;
  box_type local_a0;
  _Vector_base<int,_std::allocator<int>_> local_88;
  node_allocator_type local_70;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Matrix<float,_3,__1,_0,_3,__1>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
  local_50;
  
  local_a8.space_ = space.space_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_88,
             ((space.space_)->super_PlainObjectBase<Eigen::Matrix<float,_3,__1,_0,_3,__1>_>).
             m_storage.m_cols,(allocator_type *)&local_50);
  iVar4 = 0;
  for (piVar2 = local_88._M_impl.super__Vector_impl_data._M_start;
      piVar2 != local_88._M_impl.super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    *piVar2 = iVar4;
    iVar4 = iVar4 + 1;
  }
  box_from_bounds<pico_tree::internal::space_wrapper<Eigen::Matrix<float,3,_1,0,3,_1>>>
            (&local_a0,this,space.space_);
  local_50.allocator_ = &local_70;
  local_70.resource_._vptr_list_pool_resource = (_func_int **)&PTR__list_pool_resource_0010ed80;
  local_70.resource_.head_ = (node *)0x0;
  local_70.object_index_ = 0x100;
  local_50.stop_value_ = *(index_type *)stop_condition;
  local_50.space_ = &local_a8;
  local_50.splitter_.space_.space_ =
       (space_wrapper<Eigen::Matrix<float,_3,__1,_0,_3,__1>_>)
       (space_wrapper<Eigen::Matrix<float,_3,__1,_0,_3,__1>_>)space.space_;
  local_50.indices_ = (vector<int,_std::allocator<int>_> *)&local_88;
  pnVar3 = build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Matrix<float,_3,_-1,_0,_3,_-1>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
           ::operator()(&local_50,&local_a0);
  pnVar1 = local_70.resource_.head_;
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = local_88._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = local_88._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)((__return_storage_ptr__->root_box).storage_.coords_max._M_elems + 1) =
       local_a0.storage_.coords_max._M_elems._4_8_;
  *(undefined8 *)(__return_storage_ptr__->root_box).storage_.coords_min._M_elems =
       local_a0.storage_.coords_min._M_elems._0_8_;
  *(undefined8 *)((__return_storage_ptr__->root_box).storage_.coords_min._M_elems + 2) =
       local_a0.storage_._8_8_;
  (__return_storage_ptr__->allocator).resource_._vptr_list_pool_resource =
       (_func_int **)&PTR__list_pool_resource_0010ed80;
  local_70.resource_.head_ = (node *)0x0;
  (__return_storage_ptr__->allocator).resource_.head_ = pnVar1;
  (__return_storage_ptr__->allocator).object_index_ = local_70.object_index_;
  (__return_storage_ptr__->allocator).chunk_ = local_70.chunk_;
  __return_storage_ptr__->root_node = pnVar3;
  list_pool_resource<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL>::
  ~list_pool_resource(&local_70.resource_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

kd_tree_data_type operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const&) {
    static_assert(
        std::is_same_v<scalar_type, typename SpaceWrapper_::scalar_type>);
    static_assert(Dim_ == SpaceWrapper_::dim);
    assert(space.size() > 0);

    using build_kd_tree_impl_type =
        build_kd_tree_impl<SpaceWrapper_, Stop_, Rule_, kd_tree_data_type>;
    using node_allocator_type = typename kd_tree_data_type::node_allocator_type;

    std::vector<index_type> indices(space.size());
    std::iota(indices.begin(), indices.end(), 0);
    box_type root_box = box_from_bounds(space, start_bounds.derived());
    node_allocator_type allocator;
    node_type* root_node = build_kd_tree_impl_type{
        space, stop_condition.derived().value, indices, allocator}(root_box);

    return kd_tree_data_type{
        std::move(indices), root_box, std::move(allocator), root_node};
  }